

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

LPCOLESTR __thiscall
Parser::GetFunctionName(Parser *this,ParseNodeFnc *pnodeFnc,LPCOLESTR pNameHint)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ParseNodeVar *pPVar4;
  char16 *pcVar5;
  LPCOLESTR pOVar6;
  
  pPVar4 = pnodeFnc->pnodeName;
  if (pPVar4 == (ParseNodeVar *)0x0) {
    pOVar6 = (LPCOLESTR)0x0;
  }
  else {
    if ((pPVar4->super_ParseNode).nop != knopVarDecl) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x1e3d,"(pnodeFnc->pnodeName->nop == knopVarDecl)",
                         "pnodeFnc->pnodeName->nop == knopVarDecl");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      pPVar4 = pnodeFnc->pnodeName;
    }
    pOVar6 = (LPCOLESTR)&pPVar4->pid->field_0x22;
  }
  pcVar5 = pOVar6;
  if (pOVar6 == (LPCOLESTR)0x0) {
    pcVar5 = pNameHint;
  }
  if (pNameHint == (LPCOLESTR)0x0) {
    pcVar5 = pOVar6;
  }
  if (((pcVar5 == (LPCOLESTR)0x0) &&
      (pcVar5 = L"Anonymous function",
      (pnodeFnc->fncFlags & (kFunctionIsMethod|kFunctionDeclaration)) != kFunctionNone &&
      (pnodeFnc->fncFlags >> 0xd & 1) == 0)) &&
     (this->m_functionBody != (ParseableFunctionInfo *)0x0)) {
    pcVar5 = Js::ParseableFunctionInfo::GetExternalDisplayName(this->m_functionBody);
    return pcVar5;
  }
  return pcVar5;
}

Assistant:

LPCOLESTR Parser::GetFunctionName(ParseNodeFnc * pnodeFnc, LPCOLESTR pNameHint)
{
    LPCOLESTR name = nullptr;
    if (pnodeFnc->pnodeName != nullptr)
    {
        Assert(pnodeFnc->pnodeName->nop == knopVarDecl);
        name = pnodeFnc->pnodeName->pid->Psz();
    }
    if (name == nullptr && pNameHint != nullptr)
    {
        name = pNameHint;
    }
    if (name == nullptr && (pnodeFnc->IsLambda() ||
        (!pnodeFnc->IsDeclaration() && !pnodeFnc->IsMethod())))
    {
        name = Js::Constants::AnonymousFunction;
    }
    if (name == nullptr && m_functionBody != nullptr)
    {
        name = m_functionBody->GetExternalDisplayName();
    }
    else if (name == nullptr)
    {
        name = Js::Constants::AnonymousFunction;
    }
    return name;
}